

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

cmValue __thiscall
cmTargetInternals::GetFileSetPaths
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,string_view fileSetType)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  cmFileSet *pcVar3;
  string_view separator;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view fileSetType_local;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  fileSetType_local._M_str = fileSetType._M_str;
  fileSetType_local._M_len = fileSetType._M_len;
  pcVar3 = cmTarget::GetFileSet(self,fileSetName);
  if (pcVar3 != (cmFileSet *)0x0) {
    __x._M_str = (pcVar3->Type)._M_dataplus._M_p;
    __x._M_len = (pcVar3->Type)._M_string_length;
    bVar1 = std::operator!=(__x,fileSetType);
    if (!bVar1) {
      if ((GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
           ::output_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                                       ::output_abi_cxx11_), iVar2 != 0)) {
        GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
        ::output_abi_cxx11_._M_dataplus._M_p =
             (pointer)&GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                       ::output_abi_cxx11_.field_2;
        GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
        ::output_abi_cxx11_._M_string_length = 0;
        GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
        ::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                      ::output_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                             ::output_abi_cxx11_);
      }
      separator._M_str = ";";
      separator._M_len = 1;
      cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                ((string *)&local_88,&pcVar3->FileEntries,separator);
      std::__cxx11::string::operator=
                ((string *)
                 &GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                  ::output_abi_cxx11_,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      return (cmValue)&GetFileSetPaths(cmTarget_const*,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)
                       ::output_abi_cxx11_;
    }
    this_00 = this->Makefile;
    local_88.View_._M_len = 10;
    local_88.View_._M_str = "File set \"";
    local_58.View_._M_str = (fileSetName->_M_dataplus)._M_p;
    local_58.View_._M_len = fileSetName->_M_string_length;
    cmStrCat<char[19],std::basic_string_view<char,std::char_traits<char>>,char[3]>
              (&local_a8,&local_88,&local_58,(char (*) [19])"\" is not of type \"",
               &fileSetType_local,(char (*) [3])0x617de4);
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmTargetInternals::GetFileSetPaths(cmTarget const* self,
                                           std::string const& fileSetName,
                                           cm::string_view fileSetType) const
{
  auto const* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    return nullptr;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return nullptr;
  }
  static std::string output;
  output = cmJoin(fileSet->GetFileEntries(), ";"_s);
  return cmValue(output);
}